

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O3

bool __thiscall Am_Priority_List::Member(Am_Priority_List *this,Am_Object *obj)

{
  Am_Priority_List_Item *pAVar1;
  Am_Priority_List_Item *this_00;
  bool bVar2;
  
  pAVar1 = this->current;
  this_00 = pAVar1;
  while( true ) {
    if (this_00 == (Am_Priority_List_Item *)0x0) {
      this->current = pAVar1;
      return false;
    }
    bVar2 = Am_Object::operator==(&this_00->obj,obj);
    if (bVar2) break;
    this_00 = this->current->next;
    this->current = this_00;
  }
  return true;
}

Assistant:

bool
Am_Priority_List::Member(Am_Object obj)
{
  Am_Priority_List_Item *old_current = current;
  for (; current != nullptr; current = current->next) {
    if (current->obj == obj)
      return true;
  }
  current = old_current;
  return false;
}